

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHBuiltinVerifier_Test::TestBody
          (SSLTest_ECHBuiltinVerifier_Test *this)

{
  __uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter> _Var1;
  bool bVar2;
  int iVar3;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  X509_VERIFY_PARAM *pXVar4;
  anon_unknown_0 *paVar5;
  char *message;
  char *in_R9;
  long lVar6;
  pointer *__ptr;
  bool accept_ech;
  ScopedTrace gtest_trace_2436;
  bool use_leaf_secret;
  ScopedTrace gtest_trace_2434;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  UniquePtr<SSL_CTX> client_ctx;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<X509_STORE> store;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<X509> leaf_secret;
  UniquePtr<SSL_ECH_KEYS> wrong_keys;
  UniquePtr<X509> leaf_public;
  UniquePtr<EVP_PKEY> leaf_key;
  UniquePtr<X509> root;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  bool local_cc;
  ScopedTrace local_cb;
  bool local_ca;
  ScopedTrace local_c9;
  _Head_base<0UL,_ssl_st_*,_false> local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Head_base<0UL,_ssl_st_*,_false> local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_88;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_80;
  __uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter> local_78;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_70;
  _Head_base<0UL,_x509_st_*,_false> local_68;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_60;
  _Head_base<0UL,_x509_st_*,_false> local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  char local_44 [4];
  _Head_base<0UL,_x509_st_*,_false> local_40;
  long local_38;
  
  CertFromPEM((anon_unknown_0 *)&local_40,
              "\n-----BEGIN CERTIFICATE-----\nMIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew\nIBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl\nc3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw\ntAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92\nozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL\nGU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC\ndkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==\n-----END CERTIFICATE-----\n"
             );
  local_e0._M_head_impl._0_1_ = (X509 *)local_40._M_head_impl != (X509 *)0x0;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_40._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)0x35d5d4,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x940,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1);
    }
    if ((EVP_PKEY *)local_50._M_head_impl != (EVP_PKEY *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    goto LAB_0016bd87;
  }
  KeyFromPEM((anon_unknown_0 *)&local_50,
             "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf\n7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC\nhr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0\n-----END PRIVATE KEY-----\n"
            );
  local_e0._M_head_impl._0_1_ = (EVP_PKEY *)local_50._M_head_impl != (EVP_PKEY *)0x0;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_50._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"leaf_key","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x948,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl != (x509_st *)0x0) {
      (*(code *)(local_58._M_head_impl)->cert_info->serialNumber)();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
  }
  else {
    CertFromPEM((anon_unknown_0 *)&local_58,
                "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w\ndWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw\nwRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==\n-----END CERTIFICATE-----\n"
               );
    local_e0._M_head_impl._0_1_ = local_58._M_head_impl != (x509_st *)0x0;
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58._M_head_impl == (x509_st *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"leaf_public","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x955,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1);
      }
      if (local_68._M_head_impl != (x509_st *)0x0) {
        (*(code *)(local_68._M_head_impl)->cert_info->serialNumber)();
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
    }
    else {
      CertFromPEM((anon_unknown_0 *)&local_68,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB\nMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z\nZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO\nUmse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg\nLx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO\nK+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E\nAwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+\nXRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=\n-----END CERTIFICATE-----\n"
                 );
      local_e0._M_head_impl._0_1_ = local_68._M_head_impl != (x509_st *)0x0;
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_68._M_head_impl == (x509_st *)0x0) {
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"leaf_secret","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x962,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1
                         );
        }
        if (local_70._M_head_impl != (SSL_ECH_KEYS *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
      }
      else {
        MakeTestECHKeys((anon_unknown_0 *)&local_70,'\x01');
        local_e0._M_head_impl._0_1_ = local_70._M_head_impl != (SSL_ECH_KEYS *)0x0;
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_70._M_head_impl == (SSL_ECH_KEYS *)0x0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)0x338821,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x967,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_60)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_c0._1_7_,local_c0[0]),
                            local_b0._M_allocated_capacity + 1);
          }
          if (local_60._M_head_impl != (ssl_ech_keys_st *)0x0) {
            (**(code **)(*(long *)local_60._M_head_impl + 8))();
          }
          if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8,local_d8);
          }
        }
        else {
          MakeTestECHKeys((anon_unknown_0 *)&local_60,'\x02');
          local_e0._M_head_impl._0_1_ = local_60._M_head_impl != (ssl_ech_keys_st *)0x0;
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_60._M_head_impl == (ssl_ech_keys_st *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"wrong_keys",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x969,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_88,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_c0._1_7_,local_c0[0]),
                              local_b0._M_allocated_capacity + 1);
            }
            if (local_80._M_head_impl != (SSL_CTX *)0x0) {
              (**(code **)(*(long *)local_80._M_head_impl + 8))();
            }
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,local_d8);
            }
          }
          else {
            method = TLS_method();
            CreateContextWithTestCertificate((anon_unknown_0 *)&local_80,method);
            local_e0._M_head_impl._0_1_ = local_80._M_head_impl != (SSL_CTX *)0x0;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_80._M_head_impl == (SSL_CTX *)0x0) {
              testing::Message::Message((Message *)&local_88);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"server_ctx",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_78,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x96c,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_78,(Message *)&local_88);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_c0._1_7_,local_c0[0]),
                                local_b0._M_allocated_capacity + 1);
              }
              if (local_88._M_head_impl != (SSL_CTX *)0x0) {
                (**(code **)(*(long *)local_88._M_head_impl + 8))();
              }
              if (local_d8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,local_d8);
              }
            }
            else {
              meth = (SSL_METHOD *)TLS_method();
              local_88._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
              local_e0._M_head_impl._0_1_ = local_88._M_head_impl != (SSL_CTX *)0x0;
              local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_88._M_head_impl == (SSL_CTX *)0x0) {
                testing::Message::Message((Message *)&local_78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"client_ctx",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x96e,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_c8,(Message *)&local_78);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_c0._1_7_,local_c0[0]),
                                  local_b0._M_allocated_capacity + 1);
                }
                if (local_78._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                    (_Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)local_78._M_t.
                                        super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl
                              + 8))();
                }
                if (local_d8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_d8,local_d8);
                }
              }
              else {
                local_78._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                     (tuple<x509_store_st_*,_bssl::internal::Deleter>)X509_STORE_new();
                local_e0._M_head_impl._0_1_ =
                     (_Head_base<0UL,_x509_store_st_*,_false>)
                     local_78._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_x509_store_st_*,_false>)0x0;
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if ((_Head_base<0UL,_x509_store_st_*,_false>)
                    local_78._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl ==
                    (_Head_base<0UL,_x509_store_st_*,_false>)0x0) {
                  testing::Message::Message((Message *)&local_c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_c0,(internal *)&local_e0,(AssertionResult *)"store",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x974,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_a0,(Message *)&local_c8);
LAB_0016ba3b:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_c0._1_7_,local_c0[0]),
                                    local_b0._M_allocated_capacity + 1);
                  }
                  if ((SSL *)local_c8._M_head_impl != (SSL *)0x0) {
                    (*(local_c8._M_head_impl)->method->ssl_new)(local_c8._M_head_impl);
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                else {
                  iVar3 = X509_STORE_add_cert((X509_STORE *)
                                              local_78._M_t.
                                              super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_x509_store_st_*,_false>.
                                              _M_head_impl,(X509 *)local_40._M_head_impl);
                  _Var1._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                       local_78._M_t.
                       super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl;
                  local_e0._M_head_impl._0_1_ = iVar3 != 0;
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&local_c8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_c0,(internal *)&local_e0,
                               (AssertionResult *)"X509_STORE_add_cert(store.get(), root.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x975,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_a0,(Message *)&local_c8);
                    goto LAB_0016ba3b;
                  }
                  local_78._M_t.super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                       (tuple<x509_store_st_*,_bssl::internal::Deleter>)
                       (_Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>)0x0;
                  SSL_CTX_set_cert_store
                            ((SSL_CTX *)local_88._M_head_impl,
                             (X509_STORE *)
                             _Var1._M_t.
                             super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl);
                  SSL_CTX_set_verify((SSL_CTX *)local_88._M_head_impl,1,(callback *)0x0);
                  pXVar4 = SSL_CTX_get0_param(local_88._M_head_impl);
                  X509_VERIFY_PARAM_set_flags((X509_VERIFY_PARAM *)pXVar4,0x200000);
                  pXVar4 = SSL_CTX_get0_param(local_88._M_head_impl);
                  iVar3 = X509_VERIFY_PARAM_set1_host(pXVar4,"secret.example",0xe);
                  local_e0._M_head_impl._0_1_ = iVar3 != 0;
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&local_c8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_c0,(internal *)&local_e0,
                               (AssertionResult *)
                               "X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()), kSecretName, strlen(kSecretName))"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x97c,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_a0,(Message *)&local_c8);
                    goto LAB_0016ba3b;
                  }
                  local_44[2] = '\0';
                  local_44[3] = '\x01';
                  lVar6 = 0;
                  do {
                    local_38 = lVar6;
                    local_cc = (bool)local_44[lVar6 + 2];
                    testing::ScopedTrace::ScopedTrace<bool>
                              (&local_c9,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x982,&local_cc);
                    local_44[0] = '\0';
                    local_44[1] = '\x01';
                    lVar6 = 0;
                    do {
                      local_ca = (bool)local_44[lVar6];
                      testing::ScopedTrace::ScopedTrace<bool>
                                (&local_cb,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x984,&local_ca);
                      paVar5 = (anon_unknown_0 *)&local_60;
                      if (local_cc != false) {
                        paVar5 = (anon_unknown_0 *)&local_70;
                      }
                      iVar3 = SSL_CTX_set1_ech_keys(local_80._M_head_impl,*(SSL_ECH_KEYS **)paVar5);
                      local_e0._M_head_impl._0_1_ = iVar3 != 0;
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_c8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_c0,(internal *)&local_e0,
                                   (AssertionResult *)
                                   "SSL_CTX_set1_ech_keys( server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_a0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x988,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_a0,(Message *)&local_c8);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
                          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_c0._1_7_,local_c0[0]),
                                          local_b0._M_allocated_capacity + 1);
                        }
                        if ((SSL *)local_c8._M_head_impl != (SSL *)0x0) {
                          (*(local_c8._M_head_impl)->method->ssl_new)(local_c8._M_head_impl);
                        }
                        if (local_d8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_d8,local_d8);
                        }
LAB_0016bd17:
                        testing::ScopedTrace::~ScopedTrace(&local_cb);
                        testing::ScopedTrace::~ScopedTrace(&local_c9);
                        goto LAB_0016bd2b;
                      }
                      local_c8._M_head_impl = (ssl_st *)0x0;
                      local_a0._M_head_impl = (ssl_st *)0x0;
                      bVar2 = CreateClientAndServer
                                        ((UniquePtr<SSL> *)&local_c8,(UniquePtr<SSL> *)&local_a0,
                                         local_88._M_head_impl,local_80._M_head_impl);
                      local_e0._M_head_impl._0_1_ = bVar2;
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (!bVar2) {
                        testing::Message::Message((Message *)&local_98);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_c0,(internal *)&local_e0,
                                   (AssertionResult *)
                                   "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x98c,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
LAB_0016bcba:
                        testing::internal::AssertHelper::~AssertHelper(&local_90);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
                          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_c0._1_7_,local_c0[0]),
                                          local_b0._M_allocated_capacity + 1);
                        }
                        if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) !=
                            (long *)0x0) {
                          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_)
                                      + 8))();
                        }
                        if (local_d8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_d8,local_d8);
                        }
                        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_a0);
                        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_c8);
                        goto LAB_0016bd17;
                      }
                      bVar2 = InstallECHConfigList(local_c8._M_head_impl,local_70._M_head_impl);
                      local_e0._M_head_impl._0_1_ = bVar2;
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (!bVar2) {
                        testing::Message::Message((Message *)&local_98);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_c0,(internal *)&local_e0,
                                   (AssertionResult *)
                                   "InstallECHConfigList(client.get(), keys.get())","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x98d,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                        goto LAB_0016bcba;
                      }
                      paVar5 = (anon_unknown_0 *)&local_58;
                      if (local_ca != false) {
                        paVar5 = (anon_unknown_0 *)&local_68;
                      }
                      iVar3 = SSL_use_certificate((SSL *)local_a0._M_head_impl,*(X509 **)paVar5);
                      local_e0._M_head_impl._0_1_ = iVar3 != 0;
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_98);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_c0,(internal *)&local_e0,
                                   (AssertionResult *)
                                   "SSL_use_certificate(server.get(), use_leaf_secret ? leaf_secret.get() : leaf_public.get())"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x992,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                        goto LAB_0016bcba;
                      }
                      iVar3 = SSL_use_PrivateKey((SSL *)local_a0._M_head_impl,
                                                 (EVP_PKEY *)local_50._M_head_impl);
                      local_e0._M_head_impl._0_1_ = iVar3 != 0;
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_98);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_c0,(internal *)&local_e0,
                                   (AssertionResult *)
                                   "SSL_use_PrivateKey(server.get(), leaf_key.get())","false","true"
                                   ,in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_90,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x993,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
                        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                        goto LAB_0016bcba;
                      }
                      CompleteHandshakes(local_c8._M_head_impl,local_a0._M_head_impl);
                      local_98.data_._0_4_ = 0x3e;
                      if (local_cc == local_ca) {
                        local_98.data_._0_4_ = 0;
                      }
                      local_e0._M_head_impl =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)SSL_get_verify_result((SSL *)local_c8._M_head_impl);
                      testing::internal::CmpHelperEQ<int,long>
                                ((internal *)local_c0,"accept_ech == use_leaf_secret ? 0 : 62",
                                 "SSL_get_verify_result(client.get())",(int *)&local_98,
                                 (long *)&local_e0);
                      if (local_c0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_e0);
                        message = "";
                        if (local_b8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          message = (local_b8->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_98,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x99a,message);
                        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
                        testing::internal::AssertHelper::~AssertHelper(&local_98);
                        if (local_e0._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                        }
                      }
                      if (local_b8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_b8,local_b8);
                      }
                      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_a0);
                      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_c8);
                      testing::ScopedTrace::~ScopedTrace(&local_cb);
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 2);
                    testing::ScopedTrace::~ScopedTrace(&local_c9);
                    lVar6 = local_38 + 1;
                  } while (lVar6 != 2);
                }
LAB_0016bd2b:
                std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)&local_78);
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_88);
            }
            std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_80);
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_60);
        }
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_70);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_68);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_58);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_50);
LAB_0016bd87:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST(SSLTest, ECHBuiltinVerifier) {
  // These test certificates generated with the following Go program.
  /* clang-format off
func main() {
  notBefore := time.Date(2000, time.January, 1, 0, 0, 0, 0, time.UTC)
  notAfter := time.Date(2099, time.January, 1, 0, 0, 0, 0, time.UTC)
  rootKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  rootTemplate := &x509.Certificate{
    SerialNumber:          big.NewInt(1),
    Subject:               pkix.Name{CommonName: "Test CA"},
    NotBefore:             notBefore,
    NotAfter:              notAfter,
    BasicConstraintsValid: true,
    IsCA:                  true,
  }
  rootDER, _ := x509.CreateCertificate(rand.Reader, rootTemplate, rootTemplate, &rootKey.PublicKey, rootKey)
  root, _ := x509.ParseCertificate(rootDER)
  pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: rootDER})
  leafKey, _ := ecdsa.GenerateKey(elliptic.P256(), rand.Reader)
  leafKeyDER, _ := x509.MarshalPKCS8PrivateKey(leafKey)
  pem.Encode(os.Stdout, &pem.Block{Type: "PRIVATE KEY", Bytes: leafKeyDER})
  for i, name := range []string{"public.example", "secret.example"} {
    leafTemplate := &x509.Certificate{
      SerialNumber:          big.NewInt(int64(i) + 2),
      Subject:               pkix.Name{CommonName: name},
      NotBefore:             notBefore,
      NotAfter:              notAfter,
      BasicConstraintsValid: true,
      DNSNames:              []string{name},
    }
    leafDER, _ := x509.CreateCertificate(rand.Reader, leafTemplate, root, &leafKey.PublicKey, rootKey)
    pem.Encode(os.Stdout, &pem.Block{Type: "CERTIFICATE", Bytes: leafDER})
  }
}
clang-format on */
  bssl::UniquePtr<X509> root = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBRzCB7aADAgECAgEBMAoGCCqGSM49BAMCMBIxEDAOBgNVBAMTB1Rlc3QgQ0Ew
IBcNMDAwMTAxMDAwMDAwWhgPMjA5OTAxMDEwMDAwMDBaMBIxEDAOBgNVBAMTB1Rl
c3QgQ0EwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAAT5JUjrI1DAxSpEl88UkmJw
tAJqxo/YrSFo9V3MkcNkfTixi5p6MUtO8DazhEgekBcd2+tBAWtl7dy0qpvTqx92
ozIwMDAPBgNVHRMBAf8EBTADAQH/MB0GA1UdDgQWBBTw6ftkexAI6o4r5FntJIfL
GU5F4zAKBggqhkjOPQQDAgNJADBGAiEAiiNowddQeHZaZFIygwe6RW5/WG4sUXWC
dkyl9CQzRaYCIQCFS1EvwZbZtMny27fYm1eeYciY0TkJTEi34H1KwyzzIA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(root);
  bssl::UniquePtr<EVP_PKEY> leaf_key = KeyFromPEM(R"(
-----BEGIN PRIVATE KEY-----
MIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgj5WKHwHnziiyPauf
7QukxTwtTyGZkk8qNdms4puJfxqhRANCAARNrkhxabALDlJrHtvkuDwvCWUF/oVC
hr6PDITHi1lDlJzvVT4aXBH87sH2n2UV5zpx13NHkq1bIC8eRT8eOIe0
-----END PRIVATE KEY-----
)");
  ASSERT_TRUE(leaf_key);
  bssl::UniquePtr<X509> leaf_public = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaDCCAQ6gAwIBAgIBAjAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5w
dWJsaWMuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOcHVibGljLmV4YW1wbGUwCgYIKoZIzj0E
AwIDSAAwRQIhANqZRhDR/+QL05hsWXMYEwaiHifd9iakKoFEhKFchcF3AiBRAeXw
wRGGT6+iPmTYM6N5/IDyAb5B9Ke38O6lLEsUwA==
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_public);
  bssl::UniquePtr<X509> leaf_secret = CertFromPEM(R"(
-----BEGIN CERTIFICATE-----
MIIBaTCCAQ6gAwIBAgIBAzAKBggqhkjOPQQDAjASMRAwDgYDVQQDEwdUZXN0IENB
MCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAZMRcwFQYDVQQDEw5z
ZWNyZXQuZXhhbXBsZTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABE2uSHFpsAsO
Umse2+S4PC8JZQX+hUKGvo8MhMeLWUOUnO9VPhpcEfzuwfafZRXnOnHXc0eSrVsg
Lx5FPx44h7SjTDBKMAwGA1UdEwEB/wQCMAAwHwYDVR0jBBgwFoAU8On7ZHsQCOqO
K+RZ7SSHyxlOReMwGQYDVR0RBBIwEIIOc2VjcmV0LmV4YW1wbGUwCgYIKoZIzj0E
AwIDSQAwRgIhAPQdIz1xCFkc9WuSkxOxJDpywZiEp9SnKcxJ9nwrlRp3AiEA+O3+
XRqE7XFhHL+7TNC2a9OOAjQsEF137YPWo+rhgko=
-----END CERTIFICATE-----
)");
  ASSERT_TRUE(leaf_secret);

  // Use different config IDs so that fuzzer mode, which breaks trial
  // decryption, will observe the key mismatch.
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys(/*config_id=*/1);
  ASSERT_TRUE(keys);
  bssl::UniquePtr<SSL_ECH_KEYS> wrong_keys = MakeTestECHKeys(/*config_id=*/2);
  ASSERT_TRUE(wrong_keys);
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);

  // Configure the client to verify certificates and expect the secret name.
  // This is the name the client is trying to connect to. If ECH is rejected,
  // BoringSSL will internally override this setting with the public name.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_add_cert(store.get(), root.get()));
  SSL_CTX_set_cert_store(client_ctx.get(), store.release());
  SSL_CTX_set_verify(client_ctx.get(), SSL_VERIFY_PEER, nullptr);
  X509_VERIFY_PARAM_set_flags(SSL_CTX_get0_param(client_ctx.get()),
                              X509_V_FLAG_NO_CHECK_TIME);
  static const char kSecretName[] = "secret.example";
  ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(SSL_CTX_get0_param(client_ctx.get()),
                                          kSecretName, strlen(kSecretName)));

  // For simplicity, we only run through a pair of representative scenarios here
  // and rely on runner.go to verify that |SSL_get0_ech_name_override| behaves
  // correctly.
  for (bool accept_ech : {false, true}) {
    SCOPED_TRACE(accept_ech);
    for (bool use_leaf_secret : {false, true}) {
      SCOPED_TRACE(use_leaf_secret);

      // The server will reject ECH when configured with the wrong keys.
      ASSERT_TRUE(SSL_CTX_set1_ech_keys(
          server_ctx.get(), accept_ech ? keys.get() : wrong_keys.get()));

      bssl::UniquePtr<SSL> client, server;
      ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                        server_ctx.get()));
      ASSERT_TRUE(InstallECHConfigList(client.get(), keys.get()));

      // Configure the server with the selected certificate.
      ASSERT_TRUE(SSL_use_certificate(server.get(), use_leaf_secret
                                                        ? leaf_secret.get()
                                                        : leaf_public.get()));
      ASSERT_TRUE(SSL_use_PrivateKey(server.get(), leaf_key.get()));

      // The handshake may fail due to name mismatch or ECH reject. We check
      // |SSL_get_verify_result| to confirm the handshake got far enough.
      CompleteHandshakes(client.get(), server.get());
      EXPECT_EQ(accept_ech == use_leaf_secret ? X509_V_OK
                                              : X509_V_ERR_HOSTNAME_MISMATCH,
                SSL_get_verify_result(client.get()));
    }
  }
}